

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O2

void __thiscall tetgenmesh::flip31(tetgenmesh *this,face *flipfaces,int flipflag)

{
  face *newface;
  shellface *pppdVar1;
  int iVar2;
  shellface ppdVar3;
  shellface ppdVar4;
  shellface *pppdVar5;
  shellface ppdVar6;
  int iVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  shellface *pppdVar11;
  uint uVar12;
  long lVar13;
  undefined8 uStack_110;
  face bdedges [3];
  shellface local_d0;
  face bdsegs [3];
  face infaces [3];
  face outfaces [3];
  
  lVar8 = 8;
  do {
    *(undefined8 *)((long)&uStack_110 + lVar8) = 0;
    *(undefined4 *)((long)&bdedges[0].sh + lVar8) = 0;
    lVar8 = lVar8 + 0x10;
  } while (lVar8 != 0x38);
  lVar8 = 8;
  do {
    *(undefined8 *)((long)&infaces[2].shver + lVar8) = 0;
    *(undefined4 *)((long)&outfaces[0].sh + lVar8) = 0;
    lVar8 = lVar8 + 0x10;
  } while (lVar8 != 0x38);
  lVar8 = 8;
  do {
    *(undefined8 *)((long)&bdsegs[2].shver + lVar8) = 0;
    *(undefined4 *)((long)&infaces[0].sh + lVar8) = 0;
    lVar8 = lVar8 + 0x10;
  } while (lVar8 != 0x38);
  lVar8 = 8;
  do {
    *(undefined8 *)((long)bdsegs + lVar8 + -8) = 0;
    *(undefined4 *)((long)&bdsegs[0].sh + lVar8) = 0;
    lVar8 = lVar8 + 0x10;
  } while (lVar8 != 0x38);
  ppdVar3 = flipfaces->sh[sdestpivot[flipfaces->shver]];
  local_d0 = flipfaces[1].sh[sdestpivot[flipfaces[1].shver]];
  ppdVar4 = flipfaces[2].sh[sdestpivot[flipfaces[2].shver]];
  this->flip31count = this->flip31count + 1;
  for (lVar8 = 0; lVar8 != 3; lVar8 = lVar8 + 1) {
    pppdVar5 = flipfaces[lVar8].sh;
    bdedges[lVar8].sh = pppdVar5;
    iVar2 = snextpivot[flipfaces[lVar8].shver];
    bdedges[lVar8].shver = iVar2;
    lVar13 = (long)(iVar2 >> 1);
    ppdVar6 = pppdVar5[lVar13];
    uVar12 = (uint)ppdVar6 & 7;
    outfaces[lVar8].shver = uVar12;
    pppdVar11 = (shellface *)((ulong)ppdVar6 & 0xfffffffffffffff8);
    outfaces[lVar8].sh = pppdVar11;
    infaces[lVar8].sh = pppdVar11;
    infaces[lVar8].shver = uVar12;
    ppdVar6 = pppdVar5[lVar13 + 6];
    bdsegs[lVar8].shver = (uint)ppdVar6 & 7;
    bdsegs[lVar8].sh = (shellface *)((ulong)ppdVar6 & 0xfffffffffffffff8);
    if (ppdVar6 != (shellface)0x0 && pppdVar11 != (shellface *)0x0) {
      while( true ) {
        pppdVar1 = pppdVar11 + (uVar12 >> 1);
        pppdVar11 = (shellface *)((ulong)*pppdVar1 & 0xfffffffffffffff8);
        if (pppdVar5 == pppdVar11) break;
        uVar12 = (uint)*pppdVar1 & 7;
        infaces[lVar8].sh = pppdVar11;
        infaces[lVar8].shver = uVar12;
      }
    }
  }
  newface = flipfaces + 3;
  uStack_110._4_4_ = flipflag;
  makeshellface(this,this->subfaces,newface);
  iVar7 = uStack_110._4_4_;
  iVar2 = flipfaces[3].shver;
  flipfaces[3].sh[sorgpivot[iVar2]] = ppdVar3;
  flipfaces[3].sh[sdestpivot[iVar2]] = local_d0;
  flipfaces[3].sh[sapexpivot[iVar2]] = ppdVar4;
  pppdVar5 = flipfaces->sh;
  bdedges[0].sh = flipfaces[3].sh;
  *(undefined4 *)((long)bdedges[0].sh + (long)this->shmarkindex * 4) =
       *(undefined4 *)((long)pppdVar5 + (long)this->shmarkindex * 4);
  if (this->checkconstraints != 0) {
    bdedges[0].sh[this->areaboundindex] = pppdVar5[this->areaboundindex];
  }
  if (this->useinsertradius != 0) {
    *(undefined4 *)((long)bdedges[0].sh + (long)this->shmarkindex * 4 + 8) =
         *(undefined4 *)((long)pppdVar5 + (long)this->shmarkindex * 4 + 8);
  }
  lVar8 = (long)this->pointmarkindex;
  bdedges[0].shver = flipfaces[3].shver;
  uVar9 = (ulong)bdedges[0].shver;
  if ((*(uint *)((long)ppdVar3 + lVar8 * 4 + 4) & 0xffffff00) == 0x700) {
    ppdVar3[(long)this->point2simindex + 2] = (double *)((ulong)bdedges[0].sh | uVar9);
    bdedges[0].sh = newface->sh;
  }
  if ((*(uint *)((long)local_d0 + lVar8 * 4 + 4) & 0xffffff00) == 0x700) {
    local_d0[(long)this->point2simindex + 2] = (double *)((ulong)bdedges[0].sh | uVar9);
    bdedges[0].sh = newface->sh;
  }
  if ((*(uint *)((long)ppdVar4 + lVar8 * 4 + 4) & 0xffffff00) == 0x700) {
    ppdVar4[(long)this->point2simindex + 2] = (double *)((ulong)bdedges[0].sh | uVar9);
    bdedges[0].sh = newface->sh;
  }
  bdedges[1].sh = bdedges[0].sh;
  bdedges[1].shver = snextpivot[uVar9];
  bdedges[2].sh = bdedges[0].sh;
  bdedges[2].shver = snextpivot[snextpivot[uVar9]];
  for (lVar8 = 0; lVar8 != 0x30; lVar8 = lVar8 + 0x10) {
    uVar9 = *(ulong *)((long)&outfaces[0].sh + lVar8);
    if (uVar9 != 0) {
      lVar13 = *(long *)((long)&bdsegs[0].sh + lVar8);
      if (lVar13 == 0) {
        lVar10 = *(long *)((long)&bdedges[0].sh + lVar8);
        uVar12 = *(uint *)((long)&bdedges[0].shver + lVar8);
      }
      else {
        *(undefined4 *)((long)&bdsegs[0].shver + lVar8) = 0;
        lVar10 = *(long *)((long)&bdedges[0].sh + lVar8);
        uVar12 = *(uint *)((long)&bdedges[0].shver + lVar8);
        if (*(long *)(lVar10 + (long)sorgpivot[(int)uVar12] * 8) !=
            *(long *)(lVar13 + (long)sorgpivot[0] * 8)) {
          uVar12 = uVar12 ^ 1;
          *(uint *)((long)&bdedges[0].shver + lVar8) = uVar12;
        }
      }
      *(ulong *)(lVar10 + (long)((int)uVar12 >> 1) * 8) =
           (long)*(int *)((long)&outfaces[0].shver + lVar8) | uVar9;
      *(ulong *)(*(long *)((long)&infaces[0].sh + lVar8) +
                (long)(*(int *)((long)&infaces[0].shver + lVar8) >> 1) * 8) =
           (long)(int)uVar12 | *(ulong *)((long)&bdedges[0].sh + lVar8);
    }
    if (*(long *)((long)&bdsegs[0].sh + lVar8) != 0) {
      ssbond(this,(face *)((long)&bdedges[0].sh + lVar8),(face *)((long)&bdsegs[0].sh + lVar8));
    }
  }
  (this->recentsh).sh = flipfaces[3].sh;
  (this->recentsh).shver = flipfaces[3].shver;
  if (iVar7 != 0) {
    for (lVar8 = 0; lVar8 != 0x30; lVar8 = lVar8 + 0x10) {
      flipshpush(this,(face *)((long)&bdedges[0].sh + lVar8));
    }
  }
  return;
}

Assistant:

void tetgenmesh::flip31(face* flipfaces, int flipflag)
{
  face bdedges[3], outfaces[3], infaces[3];
  face bdsegs[3];
  face checkface;
  point pa, pb, pc;
  int i;

  pa = sdest(flipfaces[0]);
  pb = sdest(flipfaces[1]);
  pc = sdest(flipfaces[2]);

  flip31count++;

  // Collect all infos at the three boundary edges.
  for (i = 0; i < 3; i++) {
    senext(flipfaces[i], bdedges[i]);
    spivot(bdedges[i], outfaces[i]);
    infaces[i] = outfaces[i];
    sspivot(bdedges[i], bdsegs[i]);
    if (outfaces[i].sh != NULL) {
      if (isshsubseg(bdedges[i])) {
        spivot(infaces[i], checkface);
        while (checkface.sh != bdedges[i].sh) {
          infaces[i] = checkface;
          spivot(infaces[i], checkface);
        }
      }
    }
  } // i

  // Create a new subface.
  makeshellface(subfaces, &(flipfaces[3]));
  setshvertices(flipfaces[3], pa, pb,pc);
  setshellmark(flipfaces[3], shellmark(flipfaces[0]));
  if (checkconstraints) {
    //area = areabound(flipfaces[0]);
    setareabound(flipfaces[3], areabound(flipfaces[0]));
  }
  if (useinsertradius) {
    setfacetindex(flipfaces[3], getfacetindex(flipfaces[0]));
  }

  // Update the point-to-subface map.
  if (pointtype(pa) == FREEFACETVERTEX) {
    setpoint2sh(pa, sencode(flipfaces[3]));
  }
  if (pointtype(pb) == FREEFACETVERTEX) {
    setpoint2sh(pb, sencode(flipfaces[3]));
  }
  if (pointtype(pc) == FREEFACETVERTEX) {
    setpoint2sh(pc, sencode(flipfaces[3]));
  }

  // Update the three new boundary edges.
  bdedges[0] = flipfaces[3];         // [a,b]
  senext(flipfaces[3], bdedges[1]);  // [b,c]
  senext2(flipfaces[3], bdedges[2]); // [c,a]

  // Reconnect boundary edges to outer boundary faces.
  for (i = 0; i < 3; i++) {
    if (outfaces[i].sh != NULL) {
      // Make sure that the subface has the ori as the segment.
      if (bdsegs[i].sh != NULL) {
        bdsegs[i].shver = 0;
        if (sorg(bdedges[i]) != sorg(bdsegs[i])) {
          sesymself(bdedges[i]);
        }
      }
      sbond1(bdedges[i], outfaces[i]);
      sbond1(infaces[i], bdedges[i]);
    }
    if (bdsegs[i].sh != NULL) {
      ssbond(bdedges[i], bdsegs[i]);
    }
  }

  recentsh = flipfaces[3];

  if (flipflag) {
    // Put the boundary edges into flip stack.
    for (i = 0; i < 3; i++) {
      flipshpush(&(bdedges[i]));
    }
  }
}